

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<int,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToWeeksOperator>
               (int *ldata,interval_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  idx_t iVar1;
  ulong uVar2;
  idx_t row_idx;
  ulong uVar3;
  int64_t *piVar4;
  interval_t iVar5;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar4 = &result_data->micros;
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = uVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)sel_vector->sel_vector[uVar3];
      }
      iVar5 = ToWeeksOperator::Operation<int,duckdb::interval_t>(ldata[uVar2]);
      ((interval_t *)(piVar4 + -1))->months = (int)iVar5._0_8_;
      ((interval_t *)(piVar4 + -1))->days = (int)((ulong)iVar5._0_8_ >> 0x20);
      *piVar4 = iVar5.micros;
      piVar4 = piVar4 + 2;
    }
  }
  else {
    piVar4 = &result_data->micros;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar1 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar1 >> 6] >>
           (iVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        iVar5 = ToWeeksOperator::Operation<int,duckdb::interval_t>(ldata[iVar1]);
        ((interval_t *)(piVar4 + -1))->months = (int)iVar5._0_8_;
        ((interval_t *)(piVar4 + -1))->days = (int)((ulong)iVar5._0_8_ >> 0x20);
        *piVar4 = iVar5.micros;
      }
      piVar4 = piVar4 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}